

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O3

DecodeStatus
DecodeMem(MCInst *MI,uint insn,uint64_t Address,void *Decoder,_Bool isLoad,DecodeFunc DecodeRD)

{
  DecodeStatus DVar1;
  uint uVar2;
  undefined3 in_register_00000081;
  
  uVar2 = insn >> 0x19 & 0x1f;
  if ((CONCAT31(in_register_00000081,isLoad) != 0) &&
     (DVar1 = (*DecodeRD)(MI,uVar2,Address,Decoder), DVar1 != MCDisassembler_Success)) {
    return DVar1;
  }
  MCOperand_CreateReg0(MI,IntRegDecoderTable[insn >> 0xe & 0x1f]);
  if ((insn >> 0xd & 1) == 0) {
    MCOperand_CreateReg0(MI,IntRegDecoderTable[insn & 0x1f]);
  }
  else {
    MCOperand_CreateImm0
              (MI,(ulong)(uint)((int)(insn << 0x13) >> 0x13 & (int)(insn << 0x12) >> 0x1f));
  }
  if ((!isLoad) && (DVar1 = (*DecodeRD)(MI,uVar2,Address,Decoder), DVar1 != MCDisassembler_Success))
  {
    return DVar1;
  }
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeMem(MCInst *Inst,
		unsigned Insn, uint64_t Address, MCRegisterInfo *Decoder)
{
	int Offset = SignExtend32(Insn & 0xffff, 16);
	unsigned Reg = fieldFromInstruction(Insn, 16, 5);
	unsigned Base = fieldFromInstruction(Insn, 21, 5);

	Reg = getReg(Decoder, Mips_GPR32RegClassID, Reg);
	Base = getReg(Decoder, Mips_GPR32RegClassID, Base);

	if (MCInst_getOpcode(Inst) == Mips_SC){
		MCOperand_CreateReg0(Inst, Reg);
	}

	MCOperand_CreateReg0(Inst, Reg);
	MCOperand_CreateReg0(Inst, Base);
	MCOperand_CreateImm0(Inst, Offset);

	return MCDisassembler_Success;
}